

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_piecewise_merge_join.cpp
# Opt level: O1

SourceResultType __thiscall
duckdb::PhysicalPiecewiseMergeJoin::GetData
          (PhysicalPiecewiseMergeJoin *this,ExecutionContext *context,DataChunk *result,
          OperatorSourceInput *input)

{
  default_delete<duckdb::PayloadScanner> *this_00;
  vector<duckdb::InterruptState,_true> *pvVar1;
  GlobalSourceState *pGVar2;
  _Head_base<0UL,_bool_*,_false> _Var3;
  pointer pIVar4;
  pointer pLVar5;
  pointer pLVar6;
  PayloadScanner *__ptr;
  int iVar7;
  pointer pGVar8;
  pointer pGVar9;
  Allocator *allocator;
  pointer this_01;
  const_reference pvVar10;
  reference pvVar11;
  reference other;
  reference this_02;
  pointer pSVar12;
  type sorted_data;
  PayloadScanner *this_03;
  long lVar13;
  idx_t count;
  idx_t iVar14;
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *this_04;
  long lVar15;
  pointer __p;
  size_type sVar16;
  SelectionVector rsel;
  DataChunk rhs_chunk;
  bool local_b1;
  SelectionVector local_88;
  DataChunk local_70;
  
  pGVar8 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->(&(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.
                       super_PhysicalJoin.super_CachingPhysicalOperator.super_PhysicalOperator.
                       sink_state);
  pGVar2 = input->global_state;
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)(pGVar2 + 1));
  if (iVar7 != 0) {
    ::std::__throw_system_error(iVar7);
  }
  this_00 = (default_delete<duckdb::PayloadScanner> *)
            &pGVar2[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.
             __next;
  if (pGVar2[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.__next
      == (__pthread_internal_list *)0x0) {
    pGVar9 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
             ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                           *)(pGVar8 + 1));
    if ((pGVar9->global_sort_state).sorted_blocks.
        super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pGVar9->global_sort_state).sorted_blocks.
        super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_b1 = true;
      goto LAB_016cbf35;
    }
    this_02 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
              ::operator[](&(pGVar9->global_sort_state).sorted_blocks,0);
    pSVar12 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
              operator->(this_02);
    sorted_data = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
                  operator*(&pSVar12->payload_data);
    this_03 = (PayloadScanner *)operator_new(0x18);
    PayloadScanner::PayloadScanner(this_03,sorted_data,&pGVar9->global_sort_state,true);
    local_70.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    __ptr = *(PayloadScanner **)this_00;
    *(PayloadScanner **)this_00 = this_03;
    if (__ptr != (PayloadScanner *)0x0) {
      ::std::default_delete<duckdb::PayloadScanner>::operator()(this_00,__ptr);
    }
    if (local_70.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      ::std::default_delete<duckdb::PayloadScanner>::operator()
                ((default_delete<duckdb::PayloadScanner> *)&local_70,
                 (PayloadScanner *)
                 local_70.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                 super__Vector_impl_data._M_start);
    }
  }
  pGVar9 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
           ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                         *)(pGVar8 + 1));
  _Var3._M_head_impl =
       (pGVar9->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
       super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  DataChunk::DataChunk(&local_70);
  allocator = Allocator::Get(context->client);
  pGVar9 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
           ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                         *)(pGVar8 + 1));
  DataChunk::Initialize(&local_70,allocator,&(pGVar9->global_sort_state).payload_layout.types,0x800)
  ;
  SelectionVector::SelectionVector(&local_88,0x800);
  this_04 = &(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.super_PhysicalJoin.
             super_CachingPhysicalOperator.super_PhysicalOperator.children;
  local_b1 = true;
  do {
    this_01 = unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
              ::operator->((unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
                            *)this_00);
    PayloadScanner::Scan(this_01,&local_70);
    if (local_70.count == 0) {
      local_b1 = result->count == 0;
      iVar7 = 1;
    }
    else {
      pIVar4 = pGVar2[1].super_StateWithBlockableTasks.blocked_tasks.
               super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
               super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iVar14 = 0;
      count = 0;
      do {
        if (_Var3._M_head_impl[iVar14 + (long)&pIVar4->mode] == false) {
          local_88.sel_vector[count] = (sel_t)iVar14;
          count = count + 1;
        }
        iVar14 = iVar14 + 1;
      } while (local_70.count != iVar14);
      pvVar1 = &pGVar2[1].super_StateWithBlockableTasks.blocked_tasks;
      (pvVar1->super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>).
      super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)&((pvVar1->
                             super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                             ).
                             super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                             ._M_impl.super__Vector_impl_data._M_start)->mode + local_70.count);
      if (count == 0) {
        iVar7 = 0;
      }
      else {
        pvVar10 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                            (this_04,0);
        pLVar5 = (pvVar10->_M_data->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pLVar6 = (pvVar10->_M_data->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar13 = ((long)pLVar5 - (long)pLVar6 >> 3) * -0x5555555555555555;
        if (pLVar5 != pLVar6) {
          sVar16 = 0;
          do {
            pvVar11 = vector<duckdb::Vector,_true>::operator[](&result->data,sVar16);
            Vector::SetVectorType(pvVar11,CONSTANT_VECTOR);
            pvVar11 = vector<duckdb::Vector,_true>::operator[](&result->data,sVar16);
            ConstantVector::SetNull(pvVar11,true);
            sVar16 = sVar16 + 1;
          } while (lVar13 + (ulong)(lVar13 == 0) != sVar16);
        }
        pvVar10 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                            (this_04,1);
        lVar15 = (long)(pvVar10->_M_data->types).
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pvVar10->_M_data->types).
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        if (lVar15 != 0) {
          lVar15 = (lVar15 >> 3) * -0x5555555555555555;
          sVar16 = 0;
          do {
            pvVar11 = vector<duckdb::Vector,_true>::operator[](&result->data,lVar13 + sVar16);
            other = vector<duckdb::Vector,_true>::operator[](&local_70.data,sVar16);
            Vector::Slice(pvVar11,other,&local_88,count);
            sVar16 = sVar16 + 1;
          } while (lVar15 + (ulong)(lVar15 == 0) != sVar16);
        }
        result->count = count;
        iVar7 = 2;
      }
    }
  } while (iVar7 == 0);
  if (iVar7 == 2) {
    local_b1 = result->count == 0;
  }
  if (local_88.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  DataChunk::~DataChunk(&local_70);
LAB_016cbf35:
  pthread_mutex_unlock((pthread_mutex_t *)(pGVar2 + 1));
  return local_b1;
}

Assistant:

SourceResultType PhysicalPiecewiseMergeJoin::GetData(ExecutionContext &context, DataChunk &result,
                                                     OperatorSourceInput &input) const {
	D_ASSERT(PropagatesBuildSide(join_type));
	// check if we need to scan any unmatched tuples from the RHS for the full/right outer join
	auto &sink = sink_state->Cast<MergeJoinGlobalState>();
	auto &state = input.global_state.Cast<PiecewiseJoinScanState>();

	lock_guard<mutex> l(state.lock);
	if (!state.scanner) {
		// Initialize scanner (if not yet initialized)
		auto &sort_state = sink.table->global_sort_state;
		if (sort_state.sorted_blocks.empty()) {
			return SourceResultType::FINISHED;
		}
		state.scanner = make_uniq<PayloadScanner>(*sort_state.sorted_blocks[0]->payload_data, sort_state);
	}

	// if the LHS is exhausted in a FULL/RIGHT OUTER JOIN, we scan the found_match for any chunks we
	// still need to output
	const auto found_match = sink.table->found_match.get();

	DataChunk rhs_chunk;
	rhs_chunk.Initialize(Allocator::Get(context.client), sink.table->global_sort_state.payload_layout.GetTypes());
	SelectionVector rsel(STANDARD_VECTOR_SIZE);
	for (;;) {
		// Read the next sorted chunk
		state.scanner->Scan(rhs_chunk);

		const auto count = rhs_chunk.size();
		if (count == 0) {
			return result.size() == 0 ? SourceResultType::FINISHED : SourceResultType::HAVE_MORE_OUTPUT;
		}

		idx_t result_count = 0;
		// figure out which tuples didn't find a match in the RHS
		for (idx_t i = 0; i < count; i++) {
			if (!found_match[state.right_outer_position + i]) {
				rsel.set_index(result_count++, i);
			}
		}
		state.right_outer_position += count;

		if (result_count > 0) {
			// if there were any tuples that didn't find a match, output them
			const idx_t left_column_count = children[0].get().GetTypes().size();
			for (idx_t col_idx = 0; col_idx < left_column_count; ++col_idx) {
				result.data[col_idx].SetVectorType(VectorType::CONSTANT_VECTOR);
				ConstantVector::SetNull(result.data[col_idx], true);
			}
			const idx_t right_column_count = children[1].get().GetTypes().size();
			for (idx_t col_idx = 0; col_idx < right_column_count; ++col_idx) {
				result.data[left_column_count + col_idx].Slice(rhs_chunk.data[col_idx], rsel, result_count);
			}
			result.SetCardinality(result_count);
			break;
		}
	}

	return result.size() == 0 ? SourceResultType::FINISHED : SourceResultType::HAVE_MORE_OUTPUT;
}